

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SySetPut(SySet *pSet,void *pItem)

{
  void *pvVar1;
  sxu32 local_44;
  uchar *puStack_40;
  sxu32 xLen;
  uchar *xDst;
  uchar *xSrc;
  void *pNew;
  uchar *zbase;
  void *pItem_local;
  SySet *pSet_local;
  
  if (pSet->nSize <= pSet->nUsed) {
    if (pSet->pAllocator == (SyMemBackend *)0x0) {
      return -4;
    }
    if (pSet->nSize == 0) {
      pSet->nSize = 4;
    }
    pvVar1 = SyMemBackendRealloc(pSet->pAllocator,pSet->pBase,pSet->eSize * pSet->nSize * 2);
    if (pvVar1 == (void *)0x0) {
      return -1;
    }
    pSet->pBase = pvVar1;
    pSet->nSize = pSet->nSize << 1;
  }
  puStack_40 = (uchar *)((long)pSet->pBase + (ulong)(pSet->nUsed * pSet->eSize));
  xDst = (uchar *)pItem;
  for (local_44 = pSet->eSize; local_44 != 0; local_44 = local_44 - 4) {
    *puStack_40 = *xDst;
    if (local_44 == 1) break;
    puStack_40[1] = xDst[1];
    if (local_44 == 2) break;
    puStack_40[2] = xDst[2];
    if (local_44 == 3) break;
    puStack_40[3] = xDst[3];
    puStack_40 = puStack_40 + 4;
    xDst = xDst + 4;
  }
  pSet->nUsed = pSet->nUsed + 1;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SySetPut(SySet *pSet, const void *pItem)
{
	unsigned char *zbase;
	if( pSet->nUsed >= pSet->nSize ){
		void *pNew;
		if( pSet->pAllocator == 0 ){
			return  SXERR_LOCKED;
		}
		if( pSet->nSize <= 0 ){
			pSet->nSize = 4;
		}
		pNew = SyMemBackendRealloc(pSet->pAllocator, pSet->pBase, pSet->eSize * pSet->nSize * 2);
		if( pNew == 0 ){
			return SXERR_MEM;
		}
		pSet->pBase = pNew;
		pSet->nSize <<= 1;
	}
	zbase = (unsigned char *)pSet->pBase;
	SX_MACRO_FAST_MEMCPY(pItem, &zbase[pSet->nUsed * pSet->eSize], pSet->eSize);
	pSet->nUsed++;	
	return SXRET_OK;
}